

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

Result wabt::interp::Match(Limits *expected,Limits *actual,string *out_msg)

{
  string local_88;
  string local_68;
  string local_48;
  string *local_28;
  string *out_msg_local;
  Limits *actual_local;
  Limits *expected_local;
  
  local_28 = out_msg;
  out_msg_local = (string *)actual;
  actual_local = expected;
  if (actual->initial < expected->initial) {
    StringPrintf_abi_cxx11_
              (&local_48,"actual size (%lu) smaller than declared (%lu)",actual->initial,
               expected->initial);
    std::__cxx11::string::operator=((string *)local_28,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    Result::Result((Result *)((long)&expected_local + 4),Error);
    return (Result)expected_local._4_4_;
  }
  if ((expected->has_max & 1U) != 0) {
    if ((actual->has_max & 1U) == 0) {
      StringPrintf_abi_cxx11_
                (&local_68,"max size (unspecified) larger than declared (%lu)",expected->max);
      std::__cxx11::string::operator=((string *)local_28,(string *)&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      Result::Result((Result *)((long)&expected_local + 4),Error);
      return (Result)expected_local._4_4_;
    }
    if (expected->max < actual->max) {
      StringPrintf_abi_cxx11_
                (&local_88,"max size (%lu) larger than declared (%lu)",actual->max,expected->max);
      std::__cxx11::string::operator=((string *)local_28,(string *)&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      Result::Result((Result *)((long)&expected_local + 4),Error);
      return (Result)expected_local._4_4_;
    }
  }
  Result::Result((Result *)((long)&expected_local + 4),Ok);
  return (Result)expected_local._4_4_;
}

Assistant:

Result Match(const Limits& expected,
             const Limits& actual,
             std::string* out_msg) {
  if (actual.initial < expected.initial) {
    *out_msg = StringPrintf("actual size (%" PRIu64
                            ") smaller than declared (%" PRIu64 ")",
                            actual.initial, expected.initial);
    return Result::Error;
  }

  if (expected.has_max) {
    if (!actual.has_max) {
      *out_msg = StringPrintf(
          "max size (unspecified) larger than declared (%" PRIu64 ")",
          expected.max);
      return Result::Error;
    } else if (actual.max > expected.max) {
      *out_msg = StringPrintf("max size (%" PRIu64
                              ") larger than declared (%" PRIu64 ")",
                              actual.max, expected.max);
      return Result::Error;
    }
  }

  return Result::Ok;
}